

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionhandler.c
# Opt level: O2

void DestroyInternal(OPTIONHANDLER_HANDLE handle)

{
  size_t sVar1;
  undefined8 *puVar2;
  size_t index;
  
  sVar1 = VECTOR_size(handle->storage);
  for (index = 0; sVar1 != index; index = index + 1) {
    puVar2 = (undefined8 *)VECTOR_element(handle->storage,index);
    if (puVar2 != (undefined8 *)0x0) {
      (*handle->destroyOption)((char *)*puVar2,(void *)puVar2[1]);
      free((void *)*puVar2);
    }
  }
  VECTOR_destroy(handle->storage);
  free(handle);
  return;
}

Assistant:

static void DestroyInternal(OPTIONHANDLER_HANDLE handle)
{
    if (handle != NULL)
    {
        /*Codes_SRS_OPTIONHANDLER_02_016: [ Otherwise, OptionHandler_Destroy shall free all used resources. ]*/
        size_t nOptions = VECTOR_size(handle->storage), i;
        for (i = 0; i < nOptions; i++)
        {
            OPTION* option = (OPTION*)VECTOR_element(handle->storage, i);
            if (option != NULL)
            {
                handle->destroyOption(option->name, option->storage);
                free((void*)option->name);
            }
        }

        VECTOR_destroy(handle->storage);
        free(handle);
    }
}